

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_diag_sse2_128_32.c
# Opt level: O0

parasail_result_t *
parasail_nw_table_diag_sse2_128_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint uVar9;
  int iVar10;
  int32_t imm;
  uint uVar11;
  int32_t *ptr;
  int32_t *ptr_00;
  int32_t *ptr_01;
  int imm_00;
  int imm_01;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  longlong lVar12;
  long lVar13;
  undefined4 in_register_0000008c;
  longlong lVar14;
  longlong extraout_XMM0_Qa;
  longlong extraout_XMM0_Qa_00;
  longlong extraout_XMM0_Qb;
  longlong extraout_XMM0_Qb_00;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i a_07;
  __m128i a_08;
  __m128i a_09;
  __m128i a_10;
  __m128i a_11;
  __m128i a_12;
  __m128i a_13;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i b_04;
  __m128i b_05;
  __m128i b_06;
  __m128i b_07;
  __m128i b_08;
  __m128i alVar15;
  __m128i alVar16;
  __m128i mask;
  __m128i mask_00;
  __m128i mask_01;
  __m128i mask_02;
  uint in_stack_fffffffffffff878;
  int local_780;
  int local_77c;
  int local_768;
  int local_764;
  int local_750;
  int local_74c;
  int local_738;
  int local_734;
  int local_724;
  int local_720;
  int32_t value;
  __m128i cond_all;
  __m128i cond_valid_J;
  __m128i cond_valid_I;
  __m128i cond;
  __m128i vNWH;
  __m128i vMat;
  int *matrow3;
  int *matrow2;
  int *matrow1;
  int *matrow0;
  __m128i vJ;
  __m128i vF;
  __m128i vE;
  __m128i vWH;
  __m128i vNH;
  __m128i vIBoundary;
  __m128i vJLimit1;
  __m128i vJLimit;
  __m128i vILimit1;
  __m128i vILimit;
  __m128i vMax;
  __m128i vJreset;
  __m128i vI;
  __m128i vNegOne;
  __m128i vGapN;
  __m128i vN;
  __m128i vOne;
  __m128i vGap;
  __m128i vOpen;
  __m128i vNegInf;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  uint local_50c;
  int32_t score;
  int32_t POS_LIMIT;
  int32_t NEG_LIMIT;
  int32_t end_ref;
  int32_t end_query;
  int32_t j;
  int32_t i;
  parasail_result_t *result;
  int32_t *F_pr;
  int32_t *H_pr;
  int32_t *s2;
  int32_t *_F_pr;
  int32_t *_H_pr;
  int32_t *s2B;
  int32_t *s1;
  int32_t s2Len_PAD;
  int32_t s1Len_PAD;
  int32_t s1Len;
  int32_t PAD2;
  int32_t PAD;
  int32_t N;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *_s2_local;
  int _s1Len_local;
  char *_s1_local;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  int local_18;
  int iStack_14;
  int iStack_10;
  int iStack_c;
  
  lVar14 = CONCAT44(in_register_0000008c,gap);
  s2B = (int32_t *)0x0;
  if (_s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_diag_sse2_128_32","_s2");
    _s1_local = (char *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_table_diag_sse2_128_32","s2Len");
    _s1_local = (char *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_table_diag_sse2_128_32","open");
    _s1_local = (char *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_table_diag_sse2_128_32","gap");
    _s1_local = (char *)0x0;
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_diag_sse2_128_32","matrix");
    _s1_local = (char *)0x0;
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        fprintf(_stderr,"%s: missing %s\n","parasail_nw_table_diag_sse2_128_32","_s1");
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_table_diag_sse2_128_32","_s1Len");
        return (parasail_result_t *)0x0;
      }
    }
    local_720 = _s1Len;
    if (matrix->type != 0) {
      local_720 = matrix->length;
    }
    NEG_LIMIT = local_720 + -1;
    POS_LIMIT = s2Len + -1;
    if (-open < matrix->min) {
      local_724 = open + -0x80000000;
    }
    else {
      local_724 = -0x80000000 - matrix->min;
    }
    uVar9 = local_724 + 1;
    iVar10 = 0x7ffffffe - matrix->max;
    vNegInf[1] = CONCAT44(uVar9,uVar9);
    vSaturationCheckMax[0] = CONCAT44(uVar9,uVar9);
    vSaturationCheckMax[1] = CONCAT44(iVar10,iVar10);
    vSaturationCheckMin[0] = CONCAT44(iVar10,iVar10);
    _s1_local = (char *)parasail_result_new_table1(local_720,s2Len);
    if ((parasail_result_t *)_s1_local == (parasail_result_t *)0x0) {
      _s1_local = (char *)0x0;
    }
    else {
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x4401001;
      ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x20000;
      ptr = parasail_memalign_int32_t(0x10,(long)(s2Len + 6));
      ptr_00 = parasail_memalign_int32_t(0x10,(long)(s2Len + 6));
      alVar16[0] = (size_t)(s2Len + 6);
      ptr_01 = parasail_memalign_int32_t(0x10,alVar16[0]);
      if (ptr == (int32_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_00 == (int32_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else if (ptr_01 == (int32_t *)0x0) {
        _s1_local = (char *)0x0;
      }
      else {
        alVar15[0] = extraout_RDX;
        if (matrix->type == 0) {
          alVar16[0] = (size_t)(local_720 + 3);
          s2B = parasail_memalign_int32_t(0x10,alVar16[0]);
          if (s2B == (int32_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          alVar15[0] = extraout_RDX_00;
          for (end_query = 0; end_query < local_720; end_query = end_query + 1) {
            alVar15[0] = (ulong)(uint)matrix->mapper[(byte)_s1[end_query]];
            s2B[end_query] = matrix->mapper[(byte)_s1[end_query]];
          }
          for (end_query = local_720; end_query < local_720 + 3; end_query = end_query + 1) {
            s2B[end_query] = 0;
          }
        }
        for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
          alVar15[0] = (ulong)(uint)matrix->mapper[(byte)_s2[end_ref]];
          ptr[(long)end_ref + 3] = matrix->mapper[(byte)_s2[end_ref]];
        }
        for (end_ref = -3; iVar1 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          ptr[(long)end_ref + 3] = 0;
        }
        while (end_ref = iVar1, end_ref < s2Len + 3) {
          ptr[(long)end_ref + 3] = 0;
          iVar1 = end_ref + 1;
        }
        for (end_ref = 0; end_ref < s2Len; end_ref = end_ref + 1) {
          ptr_00[(long)end_ref + 3] = -(end_ref * gap) - open;
          alVar15[0] = (ulong)uVar9;
          ptr_01[(long)end_ref + 3] = uVar9;
        }
        for (end_ref = -3; iVar1 = s2Len, end_ref < 0; end_ref = end_ref + 1) {
          ptr_00[(long)end_ref + 3] = uVar9;
          alVar15[0] = (ulong)uVar9;
          ptr_01[(long)end_ref + 3] = uVar9;
        }
        while (end_ref = iVar1, end_ref < s2Len + 3) {
          ptr_00[(long)end_ref + 3] = uVar9;
          alVar15[0] = (ulong)uVar9;
          ptr_01[(long)end_ref + 3] = uVar9;
          iVar1 = end_ref + 1;
        }
        ptr_00[2] = 0;
        for (end_query = 0; end_query < local_720; end_query = end_query + 4) {
          piVar4 = matrix->matrix;
          iVar1 = matrix->size;
          if (matrix->type == 0) {
            local_734 = s2B[end_query];
          }
          else {
            if (end_query < local_720) {
              local_738 = end_query;
            }
            else {
              local_738 = local_720 + -1;
            }
            local_734 = local_738;
          }
          piVar5 = matrix->matrix;
          iVar2 = matrix->size;
          if (matrix->type == 0) {
            local_74c = s2B[end_query + 1];
          }
          else {
            if (end_query + 1 < local_720) {
              local_750 = end_query + 1;
            }
            else {
              local_750 = local_720 + -1;
            }
            local_74c = local_750;
          }
          piVar6 = matrix->matrix;
          iVar3 = matrix->size;
          if (matrix->type == 0) {
            local_764 = s2B[end_query + 2];
          }
          else {
            if (end_query + 2 < local_720) {
              local_768 = end_query + 2;
            }
            else {
              local_768 = local_720 + -1;
            }
            local_764 = local_768;
          }
          if (matrix->type == 0) {
            local_77c = s2B[end_query + 3];
          }
          else {
            if (end_query + 3 < local_720) {
              local_780 = end_query + 3;
            }
            else {
              local_780 = local_720 + -1;
            }
            local_77c = local_780;
          }
          imm_00 = matrix->size * local_77c;
          a[0] = (ulong)(uint)ptr_00[2];
          a[1] = 3;
          alVar15 = _mm_insert_epi32_rpl(a,local_77c,imm_00);
          a_00[0] = (ulong)(uint)(-(end_query * gap) - open);
          a_00[1] = 3;
          alVar16[0] = 3;
          alVar15 = _mm_insert_epi32_rpl(a_00,(int32_t)alVar15[1],imm_00);
          alVar15[0] = alVar15[1];
          ptr_00[2] = -((end_query + 4) * gap) - open;
          for (end_ref = 0; end_ref < s2Len + 3; end_ref = end_ref + 1) {
            a_01[0] = (ulong)(uint)ptr_00[(long)end_ref + 3];
            a_01[1] = 3;
            alVar16 = _mm_insert_epi32_rpl(a_01,(int32_t)alVar15[0],end_ref);
            a_04[0] = (long)end_ref;
            alVar15[0] = (ulong)(uint)ptr_01[a_04[0] + 3];
            alVar15[1]._0_4_ = 3;
            alVar15[1]._4_4_ = 0;
            lVar12 = 3;
            alVar16 = _mm_insert_epi32_rpl(alVar15,(int32_t)alVar16[1],end_ref);
            b[0] = alVar16[1];
            a_02[1] = lVar12;
            a_02[0] = alVar15[0];
            b[1] = a_04[0];
            alVar16 = _mm_max_epi32_rpl(a_02,b);
            b_00[0] = alVar16[1];
            a_03[1] = lVar12;
            a_03[0] = alVar15[0];
            b_00[1] = a_04[0];
            _mm_max_epi32_rpl(a_03,b_00);
            b_01[0] = (ulong)(uint)piVar5[(long)(iVar2 * local_74c) +
                                          (long)ptr[(long)(end_ref + -1) + 3]];
            lVar13 = (long)(end_ref + -3);
            a_04[0] = (long)ptr[lVar13 + 3];
            a_04[1]._0_4_ = piVar4[(long)(iVar1 * local_734) + (long)ptr[(long)end_ref + 3]];
            a_04[1]._4_4_ = 0;
            a_11[0] = (ulong)(uint)piVar4[(long)(iVar1 * local_734) + (long)ptr[(long)end_ref + 3]];
            b_01[1]._0_4_ = piVar6[(long)(iVar3 * local_764) + (long)ptr[(long)(end_ref + -2) + 3]];
            b_01[1]._4_4_ = 0;
            alVar15[0] = (ulong)(uint)piVar6[(long)(iVar3 * local_764) +
                                             (long)ptr[(long)(end_ref + -2) + 3]];
            alVar16 = _mm_max_epi32_rpl(a_04,b_01);
            b_02[0] = alVar16[1];
            a_05[1] = a_11[0];
            a_05[0] = a_04[0];
            b_02[1] = alVar15[0];
            alVar16 = _mm_max_epi32_rpl(a_05,b_02);
            b_03[0] = alVar16[1];
            a_06[1] = a_11[0];
            a_06[0] = a_04[0];
            b_03[1] = alVar15[0];
            mask[1] = lVar14;
            mask[0] = lVar13;
            alVar16 = _mm_blendv_epi8_rpl(a_06,b_03,mask);
            b_04[0] = alVar16[1];
            a_07[1] = a_11[0];
            a_07[0] = a_04[0];
            b_04[1] = alVar15[0];
            mask_00[1] = lVar14;
            mask_00[0] = lVar13;
            alVar16 = _mm_blendv_epi8_rpl(a_07,b_04,mask_00);
            b_05[0] = alVar16[1];
            a_08[1] = a_11[0];
            a_08[0] = a_04[0];
            b_05[1] = alVar15[0];
            mask_01[1] = lVar14;
            mask_01[0] = lVar13;
            alVar16 = _mm_blendv_epi8_rpl(a_08,b_05,mask_01);
            b_06[0] = alVar16[1];
            if (3 < end_ref) {
              a_09[1] = a_11[0];
              a_09[0] = a_04[0];
              b_06[1] = alVar15[0];
              alVar16 = _mm_min_epi32_rpl(a_09,b_06);
              b_07[0] = alVar16[1];
              a_10[1] = a_11[0];
              a_10[0] = a_04[0];
              b_07[1] = alVar15[0];
              _mm_max_epi32_rpl(a_10,b_07);
              vNegInf[1] = extraout_XMM0_Qa_00;
              vSaturationCheckMax[0] = extraout_XMM0_Qb_00;
              vSaturationCheckMax[1] = extraout_XMM0_Qa;
              vSaturationCheckMin[0] = extraout_XMM0_Qb;
            }
            alVar16[0] = (size_t)(uint)end_query;
            alVar15[0] = (ulong)(uint)s2Len;
            alVar16[1]._0_4_ = local_720;
            alVar16[1]._4_4_ = 0;
            arr_store_si128(((((parasail_result_t *)_s1_local)->field_4).rowcols)->score_row,alVar16
                            ,end_ref,s2Len,(int32_t)lVar14,in_stack_fffffffffffff878);
            in_stack_fffffffffffff878 = 0;
            auVar7._8_8_ = 0;
            auVar7._0_8_ = alVar16[0];
            imm = _mm_extract_epi32_rpl((__m128i)(auVar7 << 0x40),imm_01);
            a_11[0] = (ulong)in_stack_fffffffffffff878;
            ptr_00[(long)(end_ref + -3) + 3] = imm;
            a_11[1] = alVar16[0];
            uVar11 = _mm_extract_epi32_rpl(a_11,imm);
            b_08[0] = (ulong)uVar11;
            b_08[1] = (long)(end_ref + -3);
            ptr_01[b_08[1] + 3] = uVar11;
            a_12[1] = alVar16[0];
            a_12[0] = a_11[0];
            mask_02[1] = lVar14;
            mask_02[0] = alVar15[0];
            alVar15 = _mm_blendv_epi8_rpl(a_12,b_08,mask_02);
            alVar15[0] = alVar15[1];
          }
        }
        local_50c = uVar9;
        for (end_query = 0; end_query < 4; end_query = end_query + 1) {
          a_13[1] = alVar16[0];
          a_13[0] = 3;
          uVar11 = _mm_extract_epi32_rpl(a_13,(int)alVar15[0]);
          if ((int)local_50c < (int)uVar11) {
            local_50c = uVar11;
          }
          alVar15[0] = extraout_RDX_01;
        }
        local_48 = (int)vSaturationCheckMax[1];
        iStack_44 = (int)((ulong)vSaturationCheckMax[1] >> 0x20);
        iStack_40 = (int)vSaturationCheckMin[0];
        iStack_3c = (int)((ulong)vSaturationCheckMin[0] >> 0x20);
        local_18 = (int)vNegInf[1];
        iStack_14 = (int)((ulong)vNegInf[1] >> 0x20);
        iStack_10 = (int)vSaturationCheckMax[0];
        iStack_c = (int)((ulong)vSaturationCheckMax[0] >> 0x20);
        alVar15[0] = CONCAT44(-(uint)(iStack_3c < (int)uVar9),-(uint)(iStack_40 < (int)uVar9)) |
                     CONCAT44(-(uint)(iVar10 < iStack_c),-(uint)(iVar10 < iStack_10));
        auVar8._8_8_ = alVar15[0];
        auVar8._0_8_ = CONCAT44(-(uint)(iStack_44 < (int)uVar9),-(uint)(local_48 < (int)uVar9)) |
                       CONCAT44(-(uint)(iVar10 < iStack_14),-(uint)(iVar10 < local_18));
        if ((((((((((((((((auVar8 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar8 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar8 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar8 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar8 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar8 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar8 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar8 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (alVar15[0] >> 7 & 1) != 0) || (alVar15[0] >> 0xf & 1) != 0) ||
                (alVar15[0] >> 0x17 & 1) != 0) || (alVar15[0] >> 0x1f & 1) != 0) ||
              (alVar15[0] >> 0x27 & 1) != 0) || (alVar15[0] >> 0x2f & 1) != 0) ||
            (alVar15[0] >> 0x37 & 1) != 0) || (long)alVar15[0] < 0) {
          ((parasail_result_t *)_s1_local)->flag = ((parasail_result_t *)_s1_local)->flag | 0x40;
          local_50c = 0;
          NEG_LIMIT = 0;
          POS_LIMIT = 0;
        }
        ((parasail_result_t *)_s1_local)->score = local_50c;
        ((parasail_result_t *)_s1_local)->end_query = NEG_LIMIT;
        ((parasail_result_t *)_s1_local)->end_ref = POS_LIMIT;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(s2B);
        }
      }
    }
  }
  return (parasail_result_t *)_s1_local;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMax;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi32(NEG_LIMIT);
    vOpen = _mm_set1_epi32(open);
    vGap  = _mm_set1_epi32(gap);
    vOne = _mm_set1_epi32(1);
    vN = _mm_set1_epi32(N);
    vGapN = _mm_set1_epi32(gap*N);
    vNegOne = _mm_set1_epi32(-1);
    vI = _mm_set_epi32(0,1,2,3);
    vJreset = _mm_set_epi32(0,-1,-2,-3);
    vMax = vNegInf;
    vILimit = _mm_set1_epi32(s1Len);
    vILimit1 = _mm_sub_epi32(vILimit, vOne);
    vJLimit = _mm_set1_epi32(s2Len);
    vJLimit1 = _mm_sub_epi32(vJLimit, vOne);
    vIBoundary = _mm_set_epi32(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int32_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int32_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int32_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        vNH = _mm_srli_si128(vNH, 4);
        vNH = _mm_insert_epi32_rpl(vNH, H_pr[-1], 3);
        vWH = _mm_srli_si128(vWH, 4);
        vWH = _mm_insert_epi32_rpl(vWH, -open - i*gap, 3);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 4);
            vNH = _mm_insert_epi32_rpl(vNH, H_pr[j], 3);
            vF = _mm_srli_si128(vF, 4);
            vF = _mm_insert_epi32_rpl(vF, F_pr[j], 3);
            vF = _mm_max_epi32_rpl(
                    _mm_sub_epi32(vNH, vOpen),
                    _mm_sub_epi32(vF, vGap));
            vE = _mm_max_epi32_rpl(
                    _mm_sub_epi32(vWH, vOpen),
                    _mm_sub_epi32(vE, vGap));
            vMat = _mm_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm_add_epi32(vNWH, vMat);
            vWH = _mm_max_epi32_rpl(vNWH, vE);
            vWH = _mm_max_epi32_rpl(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm_blendv_epi8_rpl(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8_rpl(vF, vNegInf, cond);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi32_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi32_rpl(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int32_t)_mm_extract_epi32_rpl(vWH,0);
            F_pr[j-3] = (int32_t)_mm_extract_epi32_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m128i cond_valid_I = _mm_cmpeq_epi32(vI, vILimit1);
                __m128i cond_valid_J = _mm_cmpeq_epi32(vJ, vJLimit1);
                __m128i cond_all = _mm_and_si128(cond_valid_I, cond_valid_J);
                vMax = _mm_blendv_epi8_rpl(vMax, vWH, cond_all);
            }
            vJ = _mm_add_epi32(vJ, vOne);
        }
        vI = _mm_add_epi32(vI, vN);
        vIBoundary = _mm_sub_epi32(vIBoundary, vGapN);
    }

    /* max in vMax */
    for (i=0; i<N; ++i) {
        int32_t value;
        value = (int32_t) _mm_extract_epi32_rpl(vMax, 3);
        if (value > score) {
            score = value;
        }
        vMax = _mm_slli_si128(vMax, 4);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}